

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_impl.h
# Opt level: O2

void __thiscall
iqnet::Reactor<iqnet::Null_lock>::handle_user_events(Reactor<iqnet::Null_lock> *this)

{
  undefined1 *puVar1;
  _List_node_base *p_Var2;
  HandlerState hs;
  HandlerStateList called_by_user;
  HandlerState local_40;
  _List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
  local_38;
  
  local_38._M_impl._M_node._M_size = 0;
  p_Var2 = (_List_node_base *)&this->handlers_states;
  local_38._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_38;
  local_38._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_38;
  while (p_Var2 = (((_List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
                     *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)&this->handlers_states) {
    if (*(short *)((long)&p_Var2[1]._M_next + 6) != 0) {
      std::__cxx11::
      list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>::
      push_back((list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
                 *)&local_38,(value_type *)(p_Var2 + 1));
      puVar1 = (undefined1 *)((long)&p_Var2[1]._M_next + 6);
      *(ushort *)puVar1 =
           *(ushort *)puVar1 & (ushort)(*(short *)((long)&p_Var2[1]._M_next + 4) == 0);
    }
  }
  while (local_38._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_38) {
    local_40 = (HandlerState)local_38._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
    std::__cxx11::
    list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>::
    pop_front((list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
               *)&local_38);
    invoke_event_handler(this,&local_40);
  }
  std::__cxx11::
  _List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
  ::_M_clear(&local_38);
  return;
}

Assistant:

void Reactor<Lock>::handle_user_events()
{
  HandlerStateList called_by_user;
  scoped_lock lk(lock);

  for( hs_iterator i = begin(); i != end(); ++i )
  {
    if( i->revents && (i->mask | i->revents) )
    {
      called_by_user.push_back( *i );
      i->revents &= !i->mask;
    }
  }

  lk.unlock();

  while( !called_by_user.empty() )
  {
    HandlerState hs(called_by_user.front());
    called_by_user.pop_front();
    invoke_event_handler(hs);
  }
}